

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void ts_lexer_goto(Lexer *self,Length position)

{
  uint32_t uVar1;
  TSPoint TVar2;
  bool bVar3;
  TSRange *pTVar4;
  long lVar5;
  uint32_t uStack_60;
  uint32_t uStack_5c;
  TSRange *last_included_range;
  uint32_t uStack_48;
  uint32_t uStack_44;
  TSRange *included_range;
  uint i;
  _Bool found_included_range;
  Lexer *self_local;
  undefined8 local_14;
  Length position_local;
  
  position_local.bytes = position.extent.column;
  bVar3 = false;
  included_range._0_4_ = 0;
  do {
    local_14 = position._0_8_;
    if (self->included_range_count <= (ulong)(uint)included_range) {
LAB_00127f96:
      if (!bVar3) {
        lVar5 = self->included_range_count - 1;
        uVar1 = self->included_ranges[lVar5].end_byte;
        TVar2 = self->included_ranges[lVar5].end_point;
        uStack_60 = TVar2.row;
        uStack_5c = TVar2.column;
        local_14 = CONCAT44(uStack_60,uVar1);
        position_local.bytes = uStack_5c;
        self->chunk = "";
        self->chunk_start = uVar1;
        self->chunk_size = 2;
      }
      (self->token_start_position).bytes = (uint)local_14;
      (self->token_start_position).extent.row = local_14._4_4_;
      (self->token_start_position).extent.column = position_local.bytes;
      (self->token_end_position).bytes = 0;
      (self->token_end_position).extent.row = 0;
      (self->token_end_position).extent.column = 1;
      (self->current_position).bytes = (uint)local_14;
      (self->current_position).extent.row = local_14._4_4_;
      (self->current_position).extent.column = position_local.bytes;
      if ((self->chunk != (char *)0x0) &&
         (((uint)local_14 < self->chunk_start ||
          (self->chunk_start + self->chunk_size <= (uint)local_14)))) {
        self->chunk = (char *)0x0;
        self->chunk_start = 0;
        self->chunk_size = 0;
      }
      self->lookahead_size = 0;
      (self->data).lookahead = 0;
      return;
    }
    pTVar4 = self->included_ranges + (uint)included_range;
    local_14._0_4_ = position.bytes;
    if ((uint)local_14 < pTVar4->end_byte) {
      bVar3 = (uint)local_14 < pTVar4->start_byte;
      if (bVar3) {
        uStack_48 = (pTVar4->start_point).row;
        uStack_44 = (pTVar4->start_point).column;
        local_14 = CONCAT44(uStack_48,pTVar4->start_byte);
        position_local.bytes = uStack_44;
      }
      self->current_included_range_index = (ulong)(uint)included_range;
      bVar3 = true;
      goto LAB_00127f96;
    }
    included_range._0_4_ = (uint)included_range + 1;
  } while( true );
}

Assistant:

static void ts_lexer_goto(Lexer *self, Length position) {
  bool found_included_range = false;
  for (unsigned i = 0; i < self->included_range_count; i++) {
    TSRange *included_range = &self->included_ranges[i];
    if (included_range->end_byte > position.bytes) {
      if (included_range->start_byte > position.bytes) {
        position = (Length) {
          .bytes = included_range->start_byte,
          .extent = included_range->start_point,
        };
      }

      self->current_included_range_index = i;
      found_included_range = true;
      break;
    }
  }

  if (!found_included_range) {
    TSRange *last_included_range = &self->included_ranges[self->included_range_count - 1];
    position = (Length) {
      .bytes = last_included_range->end_byte,
      .extent = last_included_range->end_point,
    };
    self->chunk = empty_chunk;
    self->chunk_start = position.bytes;
    self->chunk_size = 2;
  }

  self->token_start_position = position;
  self->token_end_position = LENGTH_UNDEFINED;
  self->current_position = position;

  if (self->chunk && (position.bytes < self->chunk_start ||
                      position.bytes >= self->chunk_start + self->chunk_size)) {
    self->chunk = 0;
    self->chunk_start = 0;
    self->chunk_size = 0;
  }

  self->lookahead_size = 0;
  self->data.lookahead = 0;
}